

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

Float __thiscall
pbrt::UniversalTextureEvaluator::operator()
          (UniversalTextureEvaluator *this,FloatTextureHandle tex,TextureEvalContext ctx)

{
  anon_class_8_1_ba1d3d87 eval;
  Float FVar1;
  Tuple3<pbrt::Point3,_float> local_48 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_30 [4];
  
  eval.ctx = (TextureEvalContext *)local_48;
  local_48[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_48[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_48[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_48[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_48[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_48[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_30[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_30[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_30[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_30[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_30[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_30[1].z = ctx.dudx;
  aTStack_30[2].x = ctx.dudy;
  aTStack_30[2].y = ctx.dvdx;
  aTStack_30[2].z = ctx.dvdy;
  aTStack_30[3].x = (float)ctx.faceIndex;
  FVar1 = TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
          ::
          Dispatch<pbrt::FloatTextureHandle::Evaluate(pbrt::TextureEvalContext)const::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
                      *)tex.
                        super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                        .bits,eval);
  return FVar1;
}

Assistant:

Float UniversalTextureEvaluator::operator()(FloatTextureHandle tex,
                                            TextureEvalContext ctx) {
    return tex.Evaluate(ctx);
}